

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

ostream_t * el::base::utils::operator<<(ostream_t *os,CommandLineArgs *c)

{
  ostream *poVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 1; lVar2 < c->m_argc; lVar2 = lVar2 + 1) {
    poVar1 = ::std::operator<<((ostream *)os,"[");
    poVar1 = ::std::operator<<(poVar1,c->m_argv[lVar2]);
    ::std::operator<<(poVar1,"]");
    if (lVar2 < (long)c->m_argc + -1) {
      ::std::operator<<((ostream *)os," ");
    }
  }
  return os;
}

Assistant:

base::type::ostream_t& operator<<(base::type::ostream_t& os, const CommandLineArgs& c) {
  for (int i = 1; i < c.m_argc; ++i) {
    os << ELPP_LITERAL("[") << c.m_argv[i] << ELPP_LITERAL("]");
    if (i < c.m_argc - 1) {
      os << ELPP_LITERAL(" ");
    }
  }
  return os;
}